

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O3

CommandOptions * read_iab_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  uint uVar2;
  MDD_t MVar3;
  uint uVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  IFileReaderFactory *in_RDX;
  uint uVar9;
  string *this;
  bool bVar10;
  InterchangeObject *tmp_obj;
  FrameBuffer FrameBuffer;
  MXFReader Reader;
  Result_t result;
  int local_24c;
  long local_248;
  CommandOptions *local_240;
  FrameBuffer local_238 [8];
  uchar *local_230;
  uint local_220;
  uint local_21c;
  long *local_210 [2];
  long local_200 [11];
  MXFReader local_1a8 [64];
  int local_168 [26];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  AS_02::IAB::MXFReader::MXFReader(local_1a8,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(local_238);
  local_24c = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&local_248);
  this = (string *)local_168;
  AS_02::IAB::MXFReader::OpenRead(this);
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  if (-1 < local_168[0]) {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      read_iab_file();
    }
    local_248 = 0;
    plVar5 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
    MVar3 = ASDCP::DefaultCompositeDict();
    uVar6 = ASDCP::Dictionary::Type(MVar3);
    (**(code **)(*plVar5 + 0xa8))(local_210,plVar5,uVar6,&local_248);
    this = (string *)local_168;
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_210);
    Kumu::Result_t::~Result_t((Result_t *)local_210);
    if (-1 < local_168[0]) {
      if ((local_248 == 0) ||
         (plVar5 = (long *)__dynamic_cast(local_248,&ASDCP::MXF::InterchangeObject::typeinfo,
                                          &ASDCP::MXF::IABEssenceDescriptor::typeinfo,0),
         plVar5 == (long *)0x0)) {
        read_iab_file();
      }
      else {
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          (**(code **)(*plVar5 + 0x88))(plVar5,0);
        }
        lVar8 = plVar5[0x1f];
        if (lVar8 == 0) {
          fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n"
                 ,0x50,1,_stderr);
          AS_02::IAB::MXFReader::GetFrameCount((uint *)local_98);
          Kumu::Result_t::~Result_t(local_98);
          lVar8 = 0;
        }
        else {
          local_24c = (int)lVar8;
        }
        if ((int)lVar8 == 0) {
          fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n"
                 ,0x50,1,_stderr);
          plVar7 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
          MVar3 = ASDCP::DefaultCompositeDict();
          uVar6 = ASDCP::Dictionary::Type(MVar3);
          (**(code **)(*plVar7 + 0xa8))(local_210,plVar7,uVar6,&local_248);
          Kumu::Result_t::operator=((Result_t *)local_168,(Result_t *)local_210);
          Kumu::Result_t::~Result_t((Result_t *)local_210);
          if ((-1 < local_168[0]) &&
             (lVar8 = __dynamic_cast(local_248,&ASDCP::MXF::InterchangeObject::typeinfo,
                                     &ASDCP::MXF::SourceClip::typeinfo,0),
             *(char *)(lVar8 + 200) != '\0')) {
            local_24c = *(int *)(lVar8 + 0xc0);
          }
        }
        if (local_24c != 0) {
          ASDCP::FrameBuffer::Capacity((uint)local_100);
          Kumu::Result_t::~Result_t(local_100);
          uVar4 = *(uint *)(plVar5 + 0x1f);
          if (-1 < local_168[0]) {
            uVar1 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
            if ((uVar1 != 0) && (uVar1 < uVar4)) {
              uVar4 = uVar1;
            }
            uVar1 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
            if (uVar1 != 0) {
              if (uVar4 < uVar1) {
                read_iab_file();
                this = (string *)&Kumu::RESULT_FAIL;
                goto LAB_0010afbd;
              }
              if (uVar4 + uVar1 < uVar4) {
                uVar4 = uVar4 + uVar1;
              }
            }
            uVar9 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
            if (uVar9 < uVar4 - uVar1) {
              this = (string *)local_168;
              local_240 = Options;
              while( true ) {
                AS_02::IAB::MXFReader::ReadFrame
                          ((uint)(Result_t *)local_210,(FrameBuffer *)local_1a8);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_210);
                Kumu::Result_t::~Result_t((Result_t *)local_210);
                Options = local_240;
                if (local_168[0] < 0) break;
                bVar10 = true;
                if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
                  local_21c = uVar9;
                  fprintf(_stdout,"Frame(%d):\n",(ulong)uVar9);
                  uVar2 = *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory;
                  if (local_220 < *(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory) {
                    uVar2 = local_220;
                  }
                  Kumu::hexdump(local_230,uVar2,_stdout);
                  bVar10 = -1 < local_168[0];
                }
                Options = local_240;
                if ((!bVar10) || (uVar9 = uVar9 + 1, uVar4 - uVar1 <= uVar9)) break;
              }
            }
          }
          goto LAB_0010afbd;
        }
        read_iab_file();
      }
      Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
      goto LAB_0010afc8;
    }
  }
LAB_0010afbd:
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)this);
LAB_0010afc8:
  Kumu::Result_t::~Result_t((Result_t *)local_168);
  ASDCP::FrameBuffer::~FrameBuffer(local_238);
  AS_02::IAB::MXFReader::~MXFReader(local_1a8);
  return Options;
}

Assistant:

Result_t read_iab_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
    AESDecContext*     Context = 0;
    HMACContext*       HMAC = 0;
    AS_02::IAB::MXFReader Reader(fileReaderFactory);
    ASDCP::FrameBuffer   FrameBuffer;

    ui32_t last_frame = 0;
    ASDCP::MXF::IABEssenceDescriptor *iab_descriptor = 0;

    Result_t result = Reader.OpenRead(Options.input_filename);

    if ( KM_SUCCESS(result) )
    {
        if ( Options.verbose_flag )
        {
            fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
        }

        ASDCP::MXF::InterchangeObject* tmp_obj = 0;

        result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_IABEssenceDescriptor), &tmp_obj);

        if ( KM_SUCCESS(result) )
        {
            iab_descriptor = dynamic_cast<ASDCP::MXF::IABEssenceDescriptor*>(tmp_obj);

            if ( iab_descriptor == 0 )
            {
                fprintf(stderr, "File does not contain an essence descriptor.\n");
                return RESULT_FAIL;
            }

            if ( Options.verbose_flag )
            {
                iab_descriptor->Dump();
            }

            if ( iab_descriptor->ContainerDuration.get() == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
                Reader.GetFrameCount(last_frame);
            }
            else
            {
                last_frame = (ui32_t)iab_descriptor->ContainerDuration;
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
                result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
                if ( KM_SUCCESS(result))
                {
                    ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
                    if ( ! sourceClip->Duration.empty() )
                    {
                        last_frame = (ui32_t)sourceClip->Duration;
                    }
                }
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "Unable to determine file duration.\n");
                return RESULT_FAIL;
            }

            assert(iab_descriptor);
            FrameBuffer.Capacity(24000); // TODO what size?
            last_frame = (ui32_t)iab_descriptor->ContainerDuration;
        }
    }

    if ( ASDCP_SUCCESS(result) )
    {
        if ( Options.duration > 0 && Options.duration < last_frame )
            last_frame = Options.duration;

        if ( Options.start_frame > 0 )
        {
            if ( Options.start_frame > last_frame )
            {
                fprintf(stderr, "Start value greater than file duration.\n");
                return RESULT_FAIL;
            }

            last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
        }

        last_frame = last_frame - Options.start_frame;


    }

    for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
        result = Reader.ReadFrame(i, FrameBuffer);

        if ( ASDCP_SUCCESS(result) )
        {
            if ( Options.verbose_flag )
            {
                FrameBuffer.FrameNumber(i);
                fprintf(stdout, "Frame(%d):\n", i);
                Kumu::hexdump(FrameBuffer.RoData(), Kumu::xmin(FrameBuffer.Size(), (ui32_t)Options.fb_dump_size), stdout);
            }
        }
    }

    return result;
}